

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

void unlink_release(ll_head *q_head,ll_elem *n,int inslock)

{
  elem_ptr_t *ptr;
  ulong uVar1;
  int iVar2;
  size_t count;
  size_t count_00;
  size_t count_01;
  ll_elem *s;
  ll_elem *p;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x2f4,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  do {
  } while (1 < (q_head->q).refcnt);
  s = (ll_elem *)((q_head->q).succ & 0xfffffffffffffffc);
  p = (ll_elem *)((q_head->q).pred & 0xfffffffffffffffc | 2);
  if (s == (ll_elem *)0x0) {
    __assert_fail("s != NULL && p != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x2fe,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  if ((int)n != 0) {
    LOCK();
    uVar1 = (q_head->q).succ;
    (q_head->q).succ = (q_head->q).succ | 2;
    UNLOCK();
    if ((uVar1 >> 1 & 1) != 0) {
      __assert_fail("!(ns & FLAGGED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x30d,"void unlink_release(struct ll_head *, struct ll_elem *, int)");
    }
    s = (ll_elem *)((ulong)s | 2);
  }
  iVar2 = ptr_cas((elem_ptr_t *)q_head,&s,(ll_elem *)0x0);
  if (iVar2 == 0) {
    __assert_fail("s_cas",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x311,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  ptr = &(q_head->q).pred;
  ptr_clear_deref((elem_ptr_t *)q_head);
  deref_release((ll_head *)s,(ll_elem *)0x1,count);
  iVar2 = ptr_cas(ptr,&p,(ll_elem *)0x0);
  if (iVar2 == 0) {
    __assert_fail("p_cas",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x316,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  LOCK();
  *ptr = *ptr & 0xfffffffffffffffd;
  UNLOCK();
  ptr_clear_deref(ptr);
  deref_release((ll_head *)p,(ll_elem *)0x1,count_00);
  if ((int)n == 0) {
    deref_release(q_head,(ll_elem *)0x1,count_01);
    return;
  }
  return;
}

Assistant:

static void
unlink_release(struct ll_head *q_head, struct ll_elem *n, int inslock)
{
	struct ll_elem	*p, *s;
	int		 p_cas, s_cas;

	assert(n == ptr_clear(n));

	/* Wait until the last reference to n, not held by us, goes away. */
	while (atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 1)
		SPINWAIT();

	s = ptr_clear((struct ll_elem*)atomic_load_explicit(&n->succ,
	    memory_order_acquire));
	p = flag_combine((struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_acquire), (struct ll_elem*)FLAGGED);
	assert(s != NULL && p != NULL);

	/*
	 * Clear out the pred and succ pointers.
	 * Set succ to 0 before setting pred to 0, since the former is used to
	 * detect if the element is on the queue.
	 *
	 * Since ptr_cas maintains the FLAGGED bit, clear it manually
	 * afterwards.
	 */
	if (inslock) {
		uintptr_t ns;

		ns = atomic_fetch_or_explicit(&n->succ, FLAGGED,
		    memory_order_acq_rel);
		assert(!(ns & FLAGGED));
		s = flag_combine(s, (struct ll_elem*)FLAGGED);
	}
	s_cas = ptr_cas(&n->succ, &s, NULL);
	assert(s_cas);
	ptr_clear_deref(&n->succ);
	deref_release(q_head, s, 1);

	p_cas = ptr_cas(&n->pred, &p, NULL);
	assert(p_cas);
	atomic_fetch_and_explicit(&n->pred, ~FLAGGED, memory_order_release);
	ptr_clear_deref(&n->pred);
	deref_release(q_head, p, 1);

	/* Release our reference. */
	if (!inslock)
		deref_release(q_head, n, 1);
}